

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-file.cc
# Opt level: O1

void __thiscall PcapFile::HandleFragment(PcapFile *this,shared_ptr<Ipv4Packet> *ipv4p,istream *is)

{
  Ipv4Fragment *pIVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  uint8_t uVar3;
  ostream *poVar4;
  iterator __position;
  shared_ptr<Ipv4Fragment> *psVar5;
  shared_ptr<EigrpPacket> eigrpp;
  stringstream ss;
  undefined1 local_221;
  EigrpPacket *local_220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  uint16_t local_20a;
  shared_ptr<Ipv4Fragment> local_208;
  shared_ptr<Packet> local_1f8;
  shared_ptr<Ipv4Packet> local_1e8;
  shared_ptr<Ipv4Packet> local_1d8;
  shared_ptr<Ipv4Fragment> *local_1c8;
  istream *local_1c0;
  shared_ptr<Ipv4Fragment> local_1b8 [8];
  ios_base local_138 [264];
  
  psVar5 = (this->fragments).
           super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->fragments).
       super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = is;
  if (psVar5 != __position._M_current) {
    local_1c8 = __position._M_current;
    do {
      pIVar1 = (psVar5->super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar2 = Ipv4Fragment::IsSameIpPacket(pIVar1,&local_1d8);
      if (local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      __position._M_current = psVar5;
    } while ((!bVar2) &&
            (psVar5 = psVar5 + 1, __position._M_current = local_1c8,
            psVar5 != (this->fragments).
                      super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish));
  }
  if (__position._M_current ==
      (this->fragments).
      super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1b8[0].super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Ipv4Fragment,std::allocator<Ipv4Fragment>,std::shared_ptr<Ipv4Packet>&>
              (&local_1b8[0].super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Ipv4Fragment **)local_1b8,(allocator<Ipv4Fragment> *)&local_220,ipv4p);
    std::vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>>::
    emplace_back<std::shared_ptr<Ipv4Fragment>>
              ((vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>>
                *)&this->fragments,local_1b8);
    if (local_1b8[0].super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8[0].super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    __position._M_current =
         (this->fragments).
         super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  pIVar1 = ((__position._M_current)->super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this_00 = ((__position._M_current)->super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Ipv4Fragment::Add(pIVar1,&local_1e8,local_1c0);
  if (local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  bVar2 = Ipv4Fragment::IsComplete(pIVar1);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    Ipv4Fragment::get_data(pIVar1,(stringstream *)local_1b8);
    uVar3 = Ipv4Fragment::get_protocol(pIVar1);
    if (uVar3 == 'X') {
      local_20a = Ipv4Fragment::get_tlen(pIVar1);
      local_220 = (EigrpPacket *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<EigrpPacket,std::allocator<EigrpPacket>,std::__cxx11::stringstream&,unsigned_short>
                (&local_218,&local_220,(allocator<EigrpPacket> *)&local_221,
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1b8,&local_20a);
      local_1f8.super___shared_ptr<Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_220->super_Packet;
      local_1f8.super___shared_ptr<Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_218._M_pi;
      if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_218._M_pi)->_M_use_count = (local_218._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_218._M_pi)->_M_use_count = (local_218._M_pi)->_M_use_count + 1;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_208.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pIVar1;
      local_208.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_00;
      InsertL4Packet(this,&local_1f8,&local_208);
      if (local_208.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_1f8.super___shared_ptr<Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.super___shared_ptr<Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"unknow protocol: ",0x11);
      uVar3 = Ipv4Fragment::get_protocol(pIVar1);
      local_220._0_1_ = uVar3;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_220,1);
      local_220 = (EigrpPacket *)CONCAT71(local_220._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_220,1);
    }
    std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>::
    _M_erase(&this->fragments,__position);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void PcapFile::HandleFragment(std::shared_ptr<Ipv4Packet> ipv4p, std::istream& is)
{
    auto temp_iter = fragments.end();
    for (auto iter = fragments.begin(); iter != fragments.end(); ++iter)
    {
        if ((*iter)->IsSameIpPacket(ipv4p))
        {
            temp_iter = iter;
            break;
        }
    }

    if (temp_iter == fragments.end())
    {
        fragments.push_back(std::make_shared<Ipv4Fragment>(ipv4p));
        temp_iter = fragments.end() - 1;
    }

    auto frag = *temp_iter;
    frag->Add(ipv4p, is);

    if (frag->IsComplete())
    {
        //将完整的ip包数据提取出来
        std::stringstream ss;
        frag->get_data(ss);
        if (frag->get_protocol() == 88)  // eigrp
        {
            auto eigrpp = std::make_shared<EigrpPacket>(ss, frag->get_tlen());
            InsertL4Packet(eigrpp, frag);
        }
        else
        {
            std::cout << "unknow protocol: " << frag->get_protocol() << '\n';
        }
        //将用完的fragment删掉，节省空间和时间
        fragments.erase(temp_iter);
    }
}